

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

U32 ZSTD_finalizeOffBase(U32 rawOffset,U32 *rep,U32 ll0)

{
  int iVar1;
  
  if (rawOffset == 0) {
    __assert_fail("(rawOffset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x18ea,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
  }
  if ((ll0 == 0) && (*rep == rawOffset)) {
    return 1;
  }
  if (rep[1] == rawOffset) {
    iVar1 = 2;
  }
  else {
    if (rep[2] != rawOffset) {
      if (ll0 == 0) {
        return rawOffset + 3;
      }
      if (*rep - 1 != rawOffset) {
        return rawOffset + 3;
      }
      return 3;
    }
    iVar1 = 3;
  }
  return iVar1 - ll0;
}

Assistant:

static U32 ZSTD_finalizeOffBase(U32 rawOffset, const U32 rep[ZSTD_REP_NUM], U32 ll0)
{
    U32 offBase = OFFSET_TO_OFFBASE(rawOffset);

    if (!ll0 && rawOffset == rep[0]) {
        offBase = REPCODE1_TO_OFFBASE;
    } else if (rawOffset == rep[1]) {
        offBase = REPCODE_TO_OFFBASE(2 - ll0);
    } else if (rawOffset == rep[2]) {
        offBase = REPCODE_TO_OFFBASE(3 - ll0);
    } else if (ll0 && rawOffset == rep[0] - 1) {
        offBase = REPCODE3_TO_OFFBASE;
    }
    return offBase;
}